

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast::StringLiteral::StringLiteral(StringLiteral *this,Token *t,int line)

{
  (this->super_Expr).super_Node.lineno = line;
  (this->super_Expr).super_Node.type_value = StringLiteralType;
  (this->super_Expr).super_Node._vptr_Node = (_func_int **)&PTR__StringLiteral_00122188;
  token::Token::Token(&this->tok,t);
  std::__cxx11::string::string((string *)&this->Literal,&t->Literal);
  return;
}

Assistant:

StringLiteral(Token t, int line)
        :Expr(line, NodeType::StringLiteralType), tok{t}, Literal{t.Literal}{}